

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O0

_Bool create_deviceSASObject
                (HTTPTRANSPORT_PERDEVICE_DATA *handleData,STRING_HANDLE hostName,char *deviceId,
                char *deviceKey)

{
  int iVar1;
  STRING_HANDLE s2;
  LOGGER_LOG p_Var2;
  STRING_HANDLE handle;
  STRING_HANDLE key_00;
  HTTPAPIEX_SAS_HANDLE pHVar3;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  STRING_HANDLE key;
  STRING_HANDLE uriResource;
  LOGGER_LOG l;
  _Bool result;
  STRING_HANDLE keyName;
  char *deviceKey_local;
  char *deviceId_local;
  STRING_HANDLE hostName_local;
  HTTPTRANSPORT_PERDEVICE_DATA *handleData_local;
  
  s2 = URL_EncodeString(deviceId);
  if (s2 == (STRING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"create_deviceSASObject",0x220,1,"URL_EncodeString keyname failed");
    }
    l._7_1_ = false;
  }
  else {
    handle = STRING_clone(hostName);
    if (handle == (STRING_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                  ,"create_deviceSASObject",0x24a,1,"STRING_staticclone uri resource failed");
      }
      l._7_1_ = false;
    }
    else {
      iVar1 = STRING_concat(handle,"/devices/");
      if ((iVar1 == 0) && (iVar1 = STRING_concat_with_STRING(handle,s2), iVar1 == 0)) {
        key_00 = STRING_construct(deviceKey);
        if (key_00 == (STRING_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                      ,"create_deviceSASObject",0x23d,1,"STRING_construct Key failed");
          }
          l._7_1_ = false;
        }
        else {
          iVar1 = STRING_empty(s2);
          if (iVar1 == 0) {
            pHVar3 = HTTPAPIEX_SAS_Create(key_00,handle,s2);
            handleData->sasObject = pHVar3;
            l._7_1_ = handleData->sasObject != (HTTPAPIEX_SAS_HANDLE)0x0;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                        ,"create_deviceSASObject",0x231,1,
                        "Unable to form the device key name for the SAS");
            }
            l._7_1_ = false;
          }
          STRING_delete(key_00);
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                    ,"create_deviceSASObject",0x243,1,"STRING_concat uri resource failed");
        }
        l._7_1_ = false;
      }
      STRING_delete(handle);
    }
    STRING_delete(s2);
  }
  return l._7_1_;
}

Assistant:

static bool create_deviceSASObject(HTTPTRANSPORT_PERDEVICE_DATA* handleData, STRING_HANDLE hostName, const char * deviceId, const char * deviceKey)
{
    STRING_HANDLE keyName;
    bool result;
    keyName = URL_EncodeString(deviceId);
    if (keyName == NULL)
    {
        LogError("URL_EncodeString keyname failed");
        result = false;
    }
    else
    {
        STRING_HANDLE uriResource;
        uriResource = STRING_clone(hostName);
        if (uriResource != NULL)
        {
            if ((STRING_concat(uriResource, "/devices/") == 0) &&
                (STRING_concat_with_STRING(uriResource, keyName) == 0))
            {
                STRING_HANDLE key = STRING_construct(deviceKey);
                if (key != NULL)
                {
                    if (STRING_empty(keyName) != 0)
                    {
                        LogError("Unable to form the device key name for the SAS");
                        result = false;
                    }
                    else
                    {
                        handleData->sasObject = HTTPAPIEX_SAS_Create(key, uriResource, keyName);
                        result = (handleData->sasObject != NULL) ? (true) : (false);
                    }
                    STRING_delete(key);
                }
                else
                {
                    LogError("STRING_construct Key failed");
                    result = false;
                }
            }
            else
            {
                LogError("STRING_concat uri resource failed");
                result = false;
            }
            STRING_delete(uriResource);
        }
        else
        {
            LogError("STRING_staticclone uri resource failed");
            result = false;
        }
        STRING_delete(keyName);
    }
    return result;
}